

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O3

void __thiscall
ConfidentialTransaction_SetUnlockingScriptTest_Test::
~ConfidentialTransaction_SetUnlockingScriptTest_Test
          (ConfidentialTransaction_SetUnlockingScriptTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetUnlockingScriptTest) {
  ConfidentialTransaction tx(exp_tx_hex);
  uint32_t index = 0;
  EXPECT_NO_THROW((index = tx.AddTxIn(exp_txid, exp_index, exp_sequence)));
  EXPECT_EQ(index, 1);

  // SetUnlockingScript
  EXPECT_THROW((tx.SetUnlockingScript(index + 5, exp_script)), CfdException);
  EXPECT_NO_THROW((tx.SetUnlockingScript(index, exp_script)));

  ConfidentialTxInReference txin_ref;
  EXPECT_NO_THROW((txin_ref = tx.GetTxIn(1)));
  EXPECT_STREQ(txin_ref.GetUnlockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());

  // SetUnlockingScript2
  const ByteData exp_data1("1234567890");
  const ByteData exp_data2("1234567890123456789012345678901234567890");
  std::vector<ByteData> exp_list;
  exp_list.push_back(exp_data1);
  exp_list.push_back(exp_data2);
  EXPECT_THROW((tx.SetUnlockingScript(index + 5, exp_list)), CfdException);
  EXPECT_NO_THROW((tx.SetUnlockingScript(index, exp_list)));

  EXPECT_NO_THROW((txin_ref = tx.GetTxIn(1)));
  EXPECT_STREQ(txin_ref.GetUnlockingScript().GetHex().c_str(),
               "051234567890141234567890123456789012345678901234567890");
}